

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O2

void __thiscall foxxll::ufs_file_base::~ufs_file_base(ufs_file_base *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_ufs_file_base = pp_Var1;
  *(void **)((long)&this->_vptr_ufs_file_base + (long)pp_Var1[-3]) = vtt[1];
  close(this,(int)vtt);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

ufs_file_base::~ufs_file_base()
{
    close();
}